

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::ConsoleReporter::assertionEnded(ConsoleReporter *this,AssertionStats *_assertionStats)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  OfType OVar4;
  element_type *peVar5;
  AssertionStats *in_RSI;
  ostream *in_RDI;
  long in_FS_OFFSET;
  bool includeResults;
  AssertionResult *result;
  ConsoleAssertionPrinter printer;
  ConsoleReporter *in_stack_ffffffffffffff00;
  byte local_dd;
  AssertionResult *this_00;
  undefined1 _printInfoMessages;
  ostream *_stream;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  byte bVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &in_RSI->assertionResult;
  _stream = in_RDI;
  peVar5 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x24d9e3);
  uVar3 = (*(peVar5->super_NonCopyable)._vptr_NonCopyable[5])();
  local_dd = 1;
  if ((uVar3 & 1) == 0) {
    bVar2 = AssertionResult::isOk((AssertionResult *)in_stack_ffffffffffffff00);
    local_dd = bVar2 ^ 0xff;
  }
  if ((local_dd & 1) == 0) {
    OVar4 = AssertionResult::getResultType(this_00);
    if (OVar4 != Warning) {
      bVar6 = 0;
      goto LAB_0024daad;
    }
  }
  _printInfoMessages = (undefined1)((ulong)this_00 >> 0x38);
  lazyPrint(in_stack_ffffffffffffff00);
  anon_unknown_1::ConsoleAssertionPrinter::ConsoleAssertionPrinter
            ((ConsoleAssertionPrinter *)
             CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),_stream,in_RSI,
             (bool)_printInfoMessages);
  anon_unknown_1::ConsoleAssertionPrinter::print
            ((ConsoleAssertionPrinter *)in_stack_ffffffffffffff00);
  std::ostream::operator<<(*(void **)(in_RDI + 0x18),std::endl<char,std::char_traits<char>>);
  bVar6 = 1;
  anon_unknown_1::ConsoleAssertionPrinter::~ConsoleAssertionPrinter
            ((ConsoleAssertionPrinter *)in_stack_ffffffffffffff00);
LAB_0024daad:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar6 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool ConsoleReporter::assertionEnded(AssertionStats const& _assertionStats) {
    AssertionResult const& result = _assertionStats.assertionResult;

    bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

    // Drop out if result was successful but we're not printing them.
    if (!includeResults && result.getResultType() != ResultWas::Warning)
        return false;

    lazyPrint();

    ConsoleAssertionPrinter printer(stream, _assertionStats, includeResults);
    printer.print();
    stream << std::endl;
    return true;
}